

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::CaseEqual(StringPiece s1,StringPiece s2)

{
  char cVar1;
  size_type sVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  
  if (s1.length_ != s2.length_) {
    return false;
  }
  sVar2 = 0;
  do {
    bVar5 = s1.length_ == sVar2;
    if (bVar5) {
      return bVar5;
    }
    cVar1 = s1.ptr_[sVar2];
    cVar3 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar3 = cVar1;
    }
    cVar1 = s2.ptr_[sVar2];
    cVar4 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar4 = cVar1;
    }
    sVar2 = sVar2 + 1;
  } while (cVar3 == cVar4);
  return bVar5;
}

Assistant:

inline bool CaseEqual(StringPiece s1, StringPiece s2) {
  if (s1.size() != s2.size()) return false;
  return memcasecmp(s1.data(), s2.data(), s1.size()) == 0;
}